

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase277::run(TestCase277 *this)

{
  word **this_00;
  bool bVar1;
  Orphan<capnp::Data> *value;
  ArrayPtr<const_unsigned_char> AVar2;
  ReaderFor<capnp::Data> RVar3;
  undefined1 local_1c0 [8];
  Builder root;
  ArrayPtr<const_unsigned_char> local_188;
  bool local_171;
  undefined1 auStack_170 [7];
  bool _kj_shouldLog;
  size_t local_168;
  ArrayPtr<const_unsigned_char> local_160;
  ArrayPtr<const_unsigned_char> local_150;
  Orphanage local_130;
  undefined1 local_120 [8];
  Orphan<capnp::Data> orphan;
  MallocMessageBuilder builder;
  TestCase277 *this_local;
  
  this_00 = &orphan.builder.location;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  local_130 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  local_150 = (ArrayPtr<const_unsigned_char>)_::data("foo");
  Orphanage::newOrphanCopy<capnp::Data::Reader>
            ((Orphan<capnp::Data> *)local_120,&local_130,(Reader)local_150);
  local_160 = (ArrayPtr<const_unsigned_char>)_::data("foo");
  _auStack_170 = (ArrayPtr<const_unsigned_char>)
                 Orphan<capnp::Data>::getReader((Orphan<capnp::Data> *)local_120);
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==
                    (&local_160,(ArrayPtr<const_unsigned_char> *)auStack_170);
  if (!bVar1) {
    local_171 = kj::_::Debug::shouldLog(ERROR);
    while (local_171 != false) {
      AVar2 = (ArrayPtr<const_unsigned_char>)_::data("foo");
      local_188 = AVar2;
      RVar3 = Orphan<capnp::Data>::getReader((Orphan<capnp::Data> *)local_120);
      root._builder._32_8_ = RVar3.super_ArrayPtr<const_unsigned_char>.ptr;
      kj::_::Debug::log<char_const(&)[55],capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x119,ERROR,
                 "\"failed: expected \" \"(data(\\\"foo\\\")) == (orphan.getReader())\", data(\"foo\"), orphan.getReader()"
                 ,(char (*) [55])"failed: expected (data(\"foo\")) == (orphan.getReader())",
                 (Reader *)&local_188,(Reader *)&root._builder.dataSize);
      local_171 = false;
    }
  }
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_1c0,(MessageBuilder *)&orphan.builder.location);
  value = kj::mv<capnp::Orphan<capnp::Data>>((Orphan<capnp::Data> *)local_120);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptDataField((Builder *)local_1c0,value);
  Orphan<capnp::Data>::~Orphan((Orphan<capnp::Data> *)local_120);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  return;
}

Assistant:

TEST(Orphans, OrphanageDataCopy) {
  MallocMessageBuilder builder;

  Orphan<Data> orphan = builder.getOrphanage().newOrphanCopy(data("foo"));
  EXPECT_EQ(data("foo"), orphan.getReader());

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptDataField(kj::mv(orphan));
}